

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_read(mg_connection *conn,void *buf,size_t len)

{
  bool bVar1;
  int iVar2;
  ushort **ppuVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  size_t len_00;
  char *end;
  char lenbuf [64];
  undefined8 local_80;
  byte local_78 [72];
  
  len_00 = 0x7fffffff;
  if (len < 0x7fffffff) {
    len_00 = len;
  }
  iVar2 = 0;
  if (conn != (mg_connection *)0x0) {
    if (conn->is_chunked == 0) {
      iVar2 = mg_read_inner(conn,buf,len_00);
      return iVar2;
    }
    if (len != 0) {
      lVar6 = 0;
      do {
        if (2 < conn->is_chunked) {
          return 0;
        }
        if (conn->is_chunked != 1) {
          return -1;
        }
        if (conn->consumed_content == conn->content_len) {
          local_80 = (char *)0x0;
          uVar5 = 0;
          do {
            conn->content_len = conn->content_len + 1;
            iVar2 = mg_read_inner(conn,local_78 + uVar5,1);
            if (iVar2 != 1) {
              local_78[uVar5] = 0;
            }
            if (uVar5 == 0) {
LAB_00113cdb:
              if ((1 < uVar5) && ((local_78[uVar5] == 10 && (local_78[uVar5 - 1] == 0xd)))) {
                local_78[uVar5 + 1] = 0;
                uVar5 = strtoul((char *)local_78,(char **)&local_80,0x10);
                if (uVar5 != 0) goto LAB_00113d1b;
                conn->is_chunked = 3;
                break;
              }
              ppuVar3 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar3 + (ulong)local_78[uVar5] * 2 + 1) & 0x10) == 0) {
                conn->is_chunked = 2;
                iVar2 = 1;
                goto LAB_00113e70;
              }
            }
            else {
              if (local_78[uVar5] == 0x3b) {
                do {
                  conn->content_len = conn->content_len + 1;
                  iVar2 = mg_read_inner(conn,local_78 + uVar5,1);
                  if (iVar2 != 1) break;
                } while (local_78[uVar5] != 0xd);
              }
              if ((local_78[uVar5] != 0xd) || (local_78[uVar5 - 1] == 0xd)) goto LAB_00113cdb;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x3f);
          uVar5 = 0;
LAB_00113d1b:
          if ((local_80 == (char *)0x0) || (*local_80 != '\r')) {
            conn->is_chunked = 2;
            iVar2 = 1;
          }
          else if (conn->is_chunked == 3) {
            uVar4 = 2;
            do {
              if (conn->is_chunked != 3) break;
              conn->content_len = conn->content_len + 1;
              iVar2 = mg_read_inner(conn,local_78,1);
              if (iVar2 == 1) {
                if ((uVar4 & 0xfffffffd) == 0) {
                  uVar4 = uVar4 | 1;
                  if (local_78[0] != 0xd) {
                    uVar4 = 0;
                  }
                }
                else {
                  if (local_78[0] != 10) goto LAB_00113d89;
                  uVar4 = uVar4 + 1;
                }
              }
              else {
LAB_00113d89:
                conn->is_chunked = 2;
              }
            } while ((int)uVar4 < 4);
            iVar2 = 1;
            if (conn->is_chunked != 2) {
              conn->is_chunked = 4;
              iVar2 = 3;
            }
          }
          else {
            conn->content_len = conn->content_len + uVar5;
            iVar2 = 0;
          }
LAB_00113e70:
          if (iVar2 != 0) {
            if (iVar2 != 3) {
              return -1;
            }
            break;
          }
        }
        else {
          uVar4 = mg_read_inner(conn,(void *)((long)buf + lVar6),len_00);
          if ((int)uVar4 < 1) {
LAB_00113e7c:
            conn->is_chunked = 2;
            bVar1 = false;
          }
          else {
            lVar6 = lVar6 + (ulong)uVar4;
            len_00 = len_00 - uVar4;
            bVar1 = true;
            if (conn->consumed_content == conn->content_len) {
              conn->content_len = conn->content_len + 2;
              iVar2 = mg_read_inner(conn,local_78,2);
              if (((iVar2 != 2) || (local_78[0] != 0xd)) || (local_78[1] != '\n'))
              goto LAB_00113e7c;
            }
          }
          if (!bVar1) {
            return -1;
          }
        }
      } while (len_00 != 0);
      iVar2 = (int)lVar6;
    }
  }
  return iVar2;
}

Assistant:

CIVETWEB_API int
mg_read(struct mg_connection *conn, void *buf, size_t len)
{
	if (len > INT_MAX) {
		len = INT_MAX;
	}

	if (conn == NULL) {
		return 0;
	}

	if (conn->is_chunked) {
		size_t all_read = 0;

		while (len > 0) {
			if (conn->is_chunked >= 3) {
				/* No more data left to read */
				return 0;
			}
			if (conn->is_chunked != 1) {
				/* Has error */
				return -1;
			}

			if (conn->consumed_content != conn->content_len) {
				/* copy from the current chunk */
				int read_ret = mg_read_inner(conn, (char *)buf + all_read, len);

				if (read_ret < 1) {
					/* read error */
					conn->is_chunked = 2;
					return -1;
				}

				all_read += (size_t)read_ret;
				len -= (size_t)read_ret;

				if (conn->consumed_content == conn->content_len) {
					/* Add data bytes in the current chunk have been read,
					 * so we are expecting \r\n now. */
					char x[2];
					conn->content_len += 2;
					if ((mg_read_inner(conn, x, 2) != 2) || (x[0] != '\r')
					    || (x[1] != '\n')) {
						/* Protocol violation */
						conn->is_chunked = 2;
						return -1;
					}
				}

			} else {
				/* fetch a new chunk */
				size_t i;
				char lenbuf[64];
				char *end = NULL;
				unsigned long chunkSize = 0;

				for (i = 0; i < (sizeof(lenbuf) - 1); i++) {
					conn->content_len++;
					if (mg_read_inner(conn, lenbuf + i, 1) != 1) {
						lenbuf[i] = 0;
					}
					if ((i > 0) && (lenbuf[i] == ';')) {
						// chunk extension --> skip chars until next CR
						//
						// RFC 2616, 3.6.1 Chunked Transfer Coding
						// (https://www.rfc-editor.org/rfc/rfc2616#page-25)
						//
						// chunk          = chunk-size [ chunk-extension ] CRLF
						//                  chunk-data CRLF
						// ...
						// chunk-extension= *( ";" chunk-ext-name [ "="
						// chunk-ext-val ] )
						do
							++conn->content_len;
						while (mg_read_inner(conn, lenbuf + i, 1) == 1
						       && lenbuf[i] != '\r');
					}
					if ((i > 0) && (lenbuf[i] == '\r')
					    && (lenbuf[i - 1] != '\r')) {
						continue;
					}
					if ((i > 1) && (lenbuf[i] == '\n')
					    && (lenbuf[i - 1] == '\r')) {
						lenbuf[i + 1] = 0;
						chunkSize = strtoul(lenbuf, &end, 16);
						if (chunkSize == 0) {
							/* regular end of content */
							conn->is_chunked = 3;
						}
						break;
					}
					if (!isxdigit((unsigned char)lenbuf[i])) {
						/* illegal character for chunk length */
						conn->is_chunked = 2;
						return -1;
					}
				}
				if ((end == NULL) || (*end != '\r')) {
					/* chunksize not set correctly */
					conn->is_chunked = 2;
					return -1;
				}
				if (conn->is_chunked == 3) {
					/* try discarding trailer for keep-alive */

					// We found the last chunk (length 0) including the
					// CRLF that terminates that chunk. Now follows a possibly
					// empty trailer and a final CRLF.
					//
					// see RFC 2616, 3.6.1 Chunked Transfer Coding
					// (https://www.rfc-editor.org/rfc/rfc2616#page-25)
					//
					// Chunked-Body   = *chunk
					// 	                last-chunk
					// 	                trailer
					// 	                CRLF
					// ...
					// last-chunk     = 1*("0") [ chunk-extension ] CRLF
					// ...
					// trailer        = *(entity-header CRLF)

					int crlf_count = 2; // one CRLF already determined

					while (crlf_count < 4 && conn->is_chunked == 3) {
						++conn->content_len;
						if (mg_read_inner(conn, lenbuf, 1) == 1) {
							if ((crlf_count == 0 || crlf_count == 2)) {
								if (lenbuf[0] == '\r')
									++crlf_count;
								else
									crlf_count = 0;
							} else {
								// previous character was a CR
								// --> next character must be LF

								if (lenbuf[0] == '\n')
									++crlf_count;
								else
									conn->is_chunked = 2;
							}
						} else
							// premature end of trailer
							conn->is_chunked = 2;
					}

					if (conn->is_chunked == 2)
						return -1;
					else
						conn->is_chunked = 4;

					break;
				}

				/* append a new chunk */
				conn->content_len += (int64_t)chunkSize;
			}
		}

		return (int)all_read;
	}
	return mg_read_inner(conn, buf, len);
}